

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void __thiscall
Corrade::Utility::String::Implementation::anon_unknown_13::anon_func::anon_class_1_0_00000001::
operator()(anon_class_1_0_00000001 *this,char *data,size_t size)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  anon_class_1_0_00000001 *paVar3;
  ostream *output;
  anon_class_1_0_00000001 *paVar4;
  anon_class_1_0_00000001 *paVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  Error local_30;
  
  if (data < (char *)0x20) {
    __invoke((char *)this,(size_t)data);
    return;
  }
  auVar6[8] = 0x85;
  auVar6._0_8_ = 0x8585858585858585;
  auVar6[9] = 0x85;
  auVar6[10] = 0x85;
  auVar6[0xb] = 0x85;
  auVar6[0xc] = 0x85;
  auVar6[0xd] = 0x85;
  auVar6[0xe] = 0x85;
  auVar6[0xf] = 0x85;
  auVar6[0x10] = 0x85;
  auVar6[0x11] = 0x85;
  auVar6[0x12] = 0x85;
  auVar6[0x13] = 0x85;
  auVar6[0x14] = 0x85;
  auVar6[0x15] = 0x85;
  auVar6[0x16] = 0x85;
  auVar6[0x17] = 0x85;
  auVar6[0x18] = 0x85;
  auVar6[0x19] = 0x85;
  auVar6[0x1a] = 0x85;
  auVar6[0x1b] = 0x85;
  auVar6[0x1c] = 0x85;
  auVar6[0x1d] = 0x85;
  auVar6[0x1e] = 0x85;
  auVar6[0x1f] = 0x85;
  auVar1 = vpaddb_avx2(*(undefined1 (*) [32])this,auVar6);
  auVar7[8] = 0xe6;
  auVar7._0_8_ = 0xe6e6e6e6e6e6e6e6;
  auVar7[9] = 0xe6;
  auVar7[10] = 0xe6;
  auVar7[0xb] = 0xe6;
  auVar7[0xc] = 0xe6;
  auVar7[0xd] = 0xe6;
  auVar7[0xe] = 0xe6;
  auVar7[0xf] = 0xe6;
  auVar7[0x10] = 0xe6;
  auVar7[0x11] = 0xe6;
  auVar7[0x12] = 0xe6;
  auVar7[0x13] = 0xe6;
  auVar7[0x14] = 0xe6;
  auVar7[0x15] = 0xe6;
  auVar7[0x16] = 0xe6;
  auVar7[0x17] = 0xe6;
  auVar7[0x18] = 0xe6;
  auVar7[0x19] = 0xe6;
  auVar7[0x1a] = 0xe6;
  auVar7[0x1b] = 0xe6;
  auVar7[0x1c] = 0xe6;
  auVar7[0x1d] = 0xe6;
  auVar7[0x1e] = 0xe6;
  auVar7[0x1f] = 0xe6;
  auVar8 = vpmaxub_avx2(auVar1,auVar7);
  auVar1 = vpcmpeqb_avx2(auVar1,auVar8);
  auVar8[8] = 0xe0;
  auVar8._0_8_ = 0xe0e0e0e0e0e0e0e0;
  auVar8[9] = 0xe0;
  auVar8[10] = 0xe0;
  auVar8[0xb] = 0xe0;
  auVar8[0xc] = 0xe0;
  auVar8[0xd] = 0xe0;
  auVar8[0xe] = 0xe0;
  auVar8[0xf] = 0xe0;
  auVar8[0x10] = 0xe0;
  auVar8[0x11] = 0xe0;
  auVar8[0x12] = 0xe0;
  auVar8[0x13] = 0xe0;
  auVar8[0x14] = 0xe0;
  auVar8[0x15] = 0xe0;
  auVar8[0x16] = 0xe0;
  auVar8[0x17] = 0xe0;
  auVar8[0x18] = 0xe0;
  auVar8[0x19] = 0xe0;
  auVar8[0x1a] = 0xe0;
  auVar8[0x1b] = 0xe0;
  auVar8[0x1c] = 0xe0;
  auVar8[0x1d] = 0xe0;
  auVar8[0x1e] = 0xe0;
  auVar8[0x1f] = 0xe0;
  auVar1 = vpand_avx2(auVar1,auVar8);
  auVar1 = vpaddb_avx2(auVar1,*(undefined1 (*) [32])this);
  *(undefined1 (*) [32])this = auVar1;
  paVar3 = (anon_class_1_0_00000001 *)((ulong)(this + 0x20) & 0xffffffffffffffe0);
  if (this <= paVar3) {
    paVar5 = this + (long)data;
    paVar4 = paVar3 + 0x20;
    while (paVar4 <= paVar5) {
      auVar1 = vpaddb_avx2(*(undefined1 (*) [32])paVar3,auVar6);
      auVar2 = vpmaxub_avx2(auVar1,auVar7);
      auVar1 = vpcmpeqb_avx2(auVar1,auVar2);
      auVar1 = vpand_avx2(auVar1,auVar8);
      auVar1 = vpaddb_avx2(auVar1,*(undefined1 (*) [32])paVar3);
      *(undefined1 (*) [32])paVar3 = auVar1;
      paVar4 = paVar3 + 0x40;
      paVar3 = paVar3 + 0x20;
    }
    if (paVar3 < paVar5) {
      auVar1 = vpaddb_avx2(*(undefined1 (*) [32])(paVar5 + -0x20),auVar6);
      auVar6 = vpmaxub_avx2(auVar1,auVar7);
      auVar1 = vpcmpeqb_avx2(auVar1,auVar6);
      auVar1 = vpand_avx2(auVar1,auVar8);
      auVar1 = vpaddb_avx2(auVar1,*(undefined1 (*) [32])(paVar5 + -0x20));
      *(undefined1 (*) [32])(paVar5 + -0x20) = auVar1;
    }
    return;
  }
  output = Error::defaultOutput();
  Error::Error(&local_30,output,(Flags)0x0);
  Debug::operator<<(&local_30.super_Debug,
                    "Assertion i >= data && reinterpret_cast<std::uintptr_t>(i) % 32 == 0 failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:814"
                   );
  Error::~Error(&local_30);
  abort();
}

Assistant:

CORRADE_UTILITY_CPU_MAYBE_UNUSED CORRADE_ENABLE_AVX2 typename std::decay<decltype(lowercaseInPlace)>::type uppercaseInPlaceImplementation(Cpu::Avx2T) {
  return [](char* const data, const std::size_t size) CORRADE_ENABLE_AVX2 {
    char* const end = data + size;

    /* If we have less than 32 bytes, fall back to the SSE variant */
    /** @todo deinline it here? any speed gains from rewriting using 128-bit
        AVX? or does the compiler do that automatically? */
    if(size < 32)
        return uppercaseInPlaceImplementation(Cpu::Sse2)(data, size);

    /* Core algorithm */
    const __m256i aAndAbove = _mm256_set1_epi8(char(256u - std::uint8_t('a')));
    const __m256i lowest25 = _mm256_set1_epi8(25);
    const __m256i lowercaseBit = _mm256_set1_epi8(0x20);
    /* See the comment next to lowercaseOneVectorInPlace() above for why this
       is done in-place */
    const auto uppercaseOneVectorInPlace = [&](__m256i& chars) CORRADE_ENABLE_AVX2 {
        /* Moves 'a' and everything above to 0 and up (it overflows and wraps
           around) */
        const __m256i lowercaseInLowest25 = _mm256_add_epi8(chars, aAndAbove);
        /* Subtracts 25 with saturation, which makes the original 'a' to 'z'
           (now 0 to 25) zero and everything else non-zero */
        const __m256i lowest25IsZero = _mm256_subs_epu8(lowercaseInLowest25, lowest25);
        /* Mask indicating where uppercase letters where, i.e. which values are
           now zero */
        const __m256i maskUppercase = _mm256_cmpeq_epi8(lowest25IsZero, _mm256_setzero_si256());
        /* For the masked chars a lowercase bit is set, and the bit is then
           subtracted from the original chars, making the lowercase chars
           uppercase */
        chars = _mm256_sub_epi8(chars, _mm256_and_si256(maskUppercase, lowercaseBit));
    };

    /* Unconditionally convert the first vector in a slower, unaligned way. Any
       extra branching to avoid the unaligned load & store if already aligned
       would be most probably more expensive than the actual operation. */
    {
        __m256i chars = _mm256_loadu_si256(reinterpret_cast<const __m256i*>(data));
        uppercaseOneVectorInPlace(chars);
        _mm256_storeu_si256(reinterpret_cast<__m256i*>(data), chars);
    }

    /* Go to the next aligned position. If the pointer was already aligned,
       we'll go to the next aligned vector; if not, there will be an overlap
       and we'll convert some bytes twice. Which is fine, uppercasing
       already-uppercased data is a no-op. */
    char* i = reinterpret_cast<char*>(reinterpret_cast<std::uintptr_t>(data + 32) & ~0x1f);
    CORRADE_INTERNAL_DEBUG_ASSERT(i >= data && reinterpret_cast<std::uintptr_t>(i) % 32 == 0);

    /* Convert all aligned vectors using aligned load/store */
    for(; i + 32 <= end; i += 32) {
        __m256i chars = _mm256_load_si256(reinterpret_cast<const __m256i*>(i));
        uppercaseOneVectorInPlace(chars);
        _mm256_store_si256(reinterpret_cast<__m256i*>(i), chars);
    }

    /* Handle remaining less than a vector with an unaligned load & store,
       again overlapping back with the previous already-converted elements */
    if(i < end) {
        CORRADE_INTERNAL_DEBUG_ASSERT(i + 32 > end);
        i = end - 32;
        __m256i chars = _mm256_loadu_si256(reinterpret_cast<const __m256i*>(i));
        uppercaseOneVectorInPlace(chars);
        _mm256_storeu_si256(reinterpret_cast<__m256i*>(i), chars);
    }
  };
}